

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseFuncModuleField(WastParser *this,Module *module)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Index binding_index_offset;
  Result result;
  pointer pFVar2;
  pointer pFVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> local_1c8;
  Enum local_1c0;
  Enum local_1bc;
  undefined1 local_1b8 [8];
  TypeVector local_types;
  Func *func_1;
  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> field_1;
  Location local_180;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_160;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128 [32];
  string local_108 [32];
  iterator local_e8;
  size_type local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  Enum local_c0;
  Enum local_bc;
  Enum local_b8;
  Enum local_b4;
  Func *local_b0;
  Func *func;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> import;
  undefined1 local_98 [8];
  ModuleFieldList export_fields;
  undefined1 local_70 [8];
  string name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)local_48,this);
    name.field_2._12_4_ = Expect(this,Func);
    bVar1 = Failed((Result)name.field_2._12_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::__cxx11::string::string((string *)local_70);
      ParseBindVarOpt(this,(string *)local_70);
      intrusive_list<wabt::ModuleField>::intrusive_list
                ((intrusive_list<wabt::ModuleField> *)local_98);
      import._M_t.super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
      super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._4_4_ =
           ParseInlineExports(this,(ModuleFieldList *)local_98,First);
      bVar1 = Failed(import._M_t.
                     super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                     .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
        _M_t.super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
        super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        bVar1 = PeekMatchLpar(this,Import);
        if (bVar1) {
          CheckImportOrdering(this,module);
          MakeUnique<wabt::FuncImport,std::__cxx11::string&>
                    ((wabt *)&func,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
          pFVar2 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::
                   operator->((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>
                               *)&func);
          local_b0 = &pFVar2->func;
          pFVar2 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::get
                             ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>
                               *)&func);
          local_b4 = (Enum)ParseInlineImport(this,(Import *)pFVar2);
          bVar1 = Failed((Result)local_b4);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            local_b8 = (Enum)ParseTypeUseOpt(this,&local_b0->decl);
            bVar1 = Failed((Result)local_b8);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
              super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
              super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              local_bc = (Enum)ParseFuncSignature(this,&(local_b0->decl).sig,&local_b0->bindings);
              bVar1 = Failed((Result)local_bc);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                import._M_t.
                super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t
                .super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
                super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
              }
              else {
                field._M_t.
                super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_1_ = 1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_148,"type",
                           (allocator *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 7));
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_128,"param",
                           (allocator *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 6));
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_108,"result",
                           (allocator *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 5));
                field._M_t.
                super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_1_ = 0;
                local_e8 = &local_148;
                local_e0 = 3;
                this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&field._M_t.
                                     super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                     .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                     _M_head_impl + 3);
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::allocator(this_00);
                __l._M_len = local_e0;
                __l._M_array = local_e8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_d8,__l,this_00);
                local_c0 = (Enum)ErrorIfLpar(this,&local_d8,(char *)0x0);
                bVar1 = Failed((Result)local_c0);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_d8);
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)((long)&field._M_t.
                                        super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                        _M_head_impl + 3));
                local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_e8;
                do {
                  local_248 = local_248 + -1;
                  std::__cxx11::string::~string((string *)local_248);
                } while (local_248 != &local_148);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 5));
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 6));
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 7));
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
                }
                else {
                  GetLocation(&local_180,this);
                  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location>
                            ((wabt *)&local_160,
                             (unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *
                             )&func,&local_180);
                  std::
                  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                  ::unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                *)&field_1,&local_160);
                  Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                              *)&field_1);
                  std::
                  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                  ::~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                 *)&field_1);
                  std::
                  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                  ::~unique_ptr(&local_160);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 0;
                }
              }
            }
          }
          std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::~unique_ptr
                    ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)&func);
        }
        else {
          MakeUnique<wabt::FuncModuleField,wabt::Location&,std::__cxx11::string&>
                    ((wabt *)&func_1,(Location *)local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
          pFVar3 = std::
                   unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
                   operator->((unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                               *)&func_1);
          local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               ParseTypeUseOpt(this,&(pFVar3->func).decl);
          bVar1 = Failed(local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ =
                 ParseFuncSignature(this,&(pFVar3->func).decl.sig,&(pFVar3->func).bindings);
            bVar1 = Failed(local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
              super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
              super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_1b8);
              binding_index_offset = Func::GetNumParams(&pFVar3->func);
              local_1bc = (Enum)ParseBoundValueTypeList
                                          (this,Local,(TypeVector *)local_1b8,
                                           &(pFVar3->func).bindings,binding_index_offset);
              bVar1 = Failed((Result)local_1bc);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                import._M_t.
                super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t
                .super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
                super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
              }
              else {
                LocalTypes::Set(&(pFVar3->func).local_types,(TypeVector *)local_1b8);
                local_1c0 = (Enum)ParseTerminatingInstrList(this,&(pFVar3->func).exprs);
                bVar1 = Failed((Result)local_1c0);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
                }
                else {
                  std::
                  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
                  unique_ptr(&local_1c8,
                             (unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                              *)&func_1);
                  Module::AppendField(module,&local_1c8);
                  std::
                  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
                  ~unique_ptr(&local_1c8);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 0;
                }
              }
              std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_1b8);
            }
          }
          std::unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
          ~unique_ptr((unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                       *)&func_1);
        }
        if ((int)import._M_t.
                 super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
                 super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl == 0) {
          sVar4 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&module->funcs);
          anon_unknown_1::AppendInlineExportFields
                    (module,(ModuleFieldList *)local_98,(int)sVar4 - 1);
          result = Expect(this,Rpar);
          bVar1 = Failed(result);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            Result::Result((Result *)((long)&this_local + 4),Ok);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
        }
      }
      intrusive_list<wabt::ModuleField>::~intrusive_list
                ((intrusive_list<wabt::ModuleField> *)local_98);
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseFuncModuleField(Module* module) {
  WABT_TRACE(ParseFuncModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Func);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Func));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<FuncImport>(name);
    Func& func = import->func;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<FuncModuleField>(loc, name);
    Func& func = field->func;
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    TypeVector local_types;
    CHECK_RESULT(ParseBoundValueTypeList(TokenType::Local, &local_types,
                                         &func.bindings, func.GetNumParams()));
    func.local_types.Set(local_types);
    CHECK_RESULT(ParseTerminatingInstrList(&func.exprs));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->funcs.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}